

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem singlestep(lua_State *L)

{
  global_State *g_00;
  int iVar1;
  lu_mem local_20;
  lu_mem work;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcstopem == '\0') {
    g_00->gcstopem = '\x01';
    switch(g_00->gcstate) {
    case '\0':
      if (g_00->gray == (GCObject *)0x0) {
        g_00->gcstate = '\x01';
        local_20 = 0;
      }
      else {
        local_20 = propagatemark(g_00);
      }
      break;
    case '\x01':
      local_20 = atomic(L);
      entersweep(L);
      g_00->GCestimate = g_00->totalbytes + g_00->GCdebt;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x6c3,"lu_mem singlestep(lua_State *)");
    case '\x03':
      iVar1 = sweepstep(L,g_00,4,&g_00->finobj);
      local_20 = (lu_mem)iVar1;
      break;
    case '\x04':
      iVar1 = sweepstep(L,g_00,5,&g_00->tobefnz);
      local_20 = (lu_mem)iVar1;
      break;
    case '\x05':
      iVar1 = sweepstep(L,g_00,6,(GCObject **)0x0);
      local_20 = (lu_mem)iVar1;
      break;
    case '\x06':
      checkSizes(L,g_00);
      g_00->gcstate = '\a';
      local_20 = 0;
      break;
    case '\a':
      if ((g_00->tobefnz == (GCObject *)0x0) || (g_00->gcemergency != '\0')) {
        g_00->gcstate = '\b';
        local_20 = 0;
      }
      else {
        g_00->gcstopem = '\0';
        iVar1 = runafewfinalizers(L,10);
        local_20 = (lu_mem)(iVar1 * 0x32);
      }
      break;
    case '\b':
      restartcollection(g_00);
      g_00->gcstate = '\0';
      local_20 = 1;
    }
    g_00->gcstopem = '\0';
    return local_20;
  }
  __assert_fail("!g->gcstopem",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x68e,"lu_mem singlestep(lua_State *)");
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  lu_mem work;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      work = 1;
      break;
    }
    case GCSpropagate: {
      if (g->gray == NULL) {  /* no more gray objects? */
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        work = 0;
      }
      else
        work = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      work = sweepstep(L, g, GCSswpfinobj, &g->finobj);
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      work = sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      work = sweepstep(L, g, GCSswpend, NULL);
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      work = 0;
      break;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        work = runafewfinalizers(L, GCFINMAX) * GCFINALIZECOST;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        work = 0;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return work;
}